

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_map.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  long lVar5;
  cake_iterator<false> *pcVar6;
  int local_b14;
  iterator iter;
  multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lolz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  aDict;
  
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::skiplist(&aDict);
  std::__cxx11::string::string((string *)&local_a58,"hello",(allocator *)&lolz);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert(&aDict,10,&local_a58);
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::string((string *)&local_a78,"jello",(allocator *)&lolz);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert(&aDict,0x14,&local_a78);
  std::__cxx11::string::~string((string *)&local_a78);
  std::__cxx11::string::string((string *)&local_a98,"yello",(allocator *)&lolz);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert(&aDict,0x14,&local_a98);
  std::__cxx11::string::~string((string *)&local_a98);
  std::__cxx11::string::string((string *)&local_ab8,"fello",(allocator *)&lolz);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::insert(&aDict,0x28,&local_ab8);
  std::__cxx11::string::~string((string *)&local_ab8);
  operator<<((ostream *)&std::cout,&aDict);
  std::operator<<((ostream *)&std::cout,"SKIPLIST:\n");
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::begin(&iter,&aDict);
  while( true ) {
    if (iter.node_count_ == 0 &&
        iter.node ==
        (SLNode<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) break;
    std::__cxx11::string::string
              ((string *)&lolz,
               (string *)
               (((iter.node)->valz).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
               ((long)iter.node_count_ref_ - (long)iter.node_count_)));
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&lolz);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&lolz);
    skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
    ::cake_iterator<false>::operator++(&iter);
  }
  lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &lolz._M_t._M_impl.super__Rb_tree_header._M_header;
  lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  lolz._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b14 = 10;
  lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>
            ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&iter,&local_b14,(char (*) [6])"hello");
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_insert_equal<std::pair<int_const,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&lolz,(pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&iter);
  std::__cxx11::string::~string((string *)&iter.reverse_);
  local_b14 = 0x14;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>
            ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&iter,&local_b14,(char (*) [6])"jello");
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_insert_equal<std::pair<int_const,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&lolz,(pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&iter);
  std::__cxx11::string::~string((string *)&iter.reverse_);
  local_b14 = 0x14;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>
            ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&iter,&local_b14,(char (*) [6])"yello");
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_insert_equal<std::pair<int_const,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&lolz,(pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&iter);
  std::__cxx11::string::~string((string *)&iter.reverse_);
  local_b14 = 0x28;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>
            ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&iter,&local_b14,(char (*) [6])"fello");
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_insert_equal<std::pair<int_const,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&lolz,(pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&iter);
  std::__cxx11::string::~string((string *)&iter.reverse_);
  std::operator<<((ostream *)&std::cout,"MULTISET:\n");
  for (p_Var3 = lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &lolz._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&iter,(pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(p_Var3 + 1));
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iter.node_count_);
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::operator<<(poVar2,(string *)&iter.reverse_);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&iter.reverse_);
  }
  std::operator<<((ostream *)&std::cout,"MULTISET:\n");
  iter.node_count_ = 0x14;
  iVar4 = std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&lolz._M_t,&iter.node_count_);
  poVar2 = std::operator<<((ostream *)&std::cout,"Found: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar4._M_node[1]._M_color);
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = std::operator<<(poVar2,(string *)&iVar4._M_node[1]._M_parent);
  std::operator<<(poVar2,"\n");
  lVar5 = std::_Rb_tree_increment(iVar4._M_node);
  poVar2 = std::operator<<((ostream *)&std::cout,"Next: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,*(int *)(lVar5 + 0x20));
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = std::operator<<(poVar2,(string *)(lVar5 + 0x28));
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Count: ");
  iter.node_count_ = 0x14;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::count(&lolz._M_t,&iter.node_count_);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"SKIPLIST:\n");
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::find(&iter,&aDict,0x14);
  poVar2 = std::operator<<((ostream *)&std::cout,"Found: ");
  poVar2 = std::operator<<(poVar2,(string *)
                                  (((iter.node)->valz).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                                  ((long)iter.node_count_ref_ - (long)iter.node_count_)));
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Next: ");
  pcVar6 = skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
           ::cake_iterator<false>::operator++(&iter);
  poVar2 = std::operator<<(poVar2,(string *)
                                  ((pcVar6->node->valz).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                                  ((long)pcVar6->node_count_ref_ - (long)pcVar6->node_count_)));
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Count: ");
  iVar1 = skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
          ::count(&aDict,0x14);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&lolz._M_t);
  skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
  ::~skiplist(&aDict);
  return 0;
}

Assistant:

int main() {
  skiplist<int, std::string> aDict;

  aDict.insert(10, "hello");
  aDict.insert(20, "jello");
  aDict.insert(20, "yello");
  aDict.insert(40, "fello");

  std::cout << aDict;

  // foundit(aDict, DictKey{10});
  // foundit(aDict, DictKey{20});
  // foundit(aDict, DictKey{30});
  std::cout << "SKIPLIST:\n";
  for(auto e: aDict)
    std::cout << e << "\n";

  // same operations on multiset
  std::multimap<int, std::string> lolz;
  lolz.insert({10, "hello"});
  lolz.insert({20, "jello"});
  lolz.insert({20, "yello"});
  lolz.insert({40, "fello"});

  std::cout << "MULTISET:\n";
  for(auto e: lolz)
    std::cout << e.first << ":" << e.second << "\n";

  // what about a find?
  // returns the first element inserted apparently
  std::cout << "MULTISET:\n";
  auto it = lolz.find(20);
  std::cout << "Found: " << it->first << ":" << it->second << "\n";
  auto next = ++it;
  std::cout << "Next: " << next->first << ":" << next->second << "\n";
  std::cout << "Count: " << lolz.count(20) << "\n";

  // now to repeat it with our data structure
  std::cout << "SKIPLIST:\n";
  auto iter = aDict.find(20);
  std::cout << "Found: " << *iter << "\n";
  std::cout << "Next: " << *++iter << "\n";
  std::cout << "Count: " << aDict.count(20) << "\n";

  return 0;
}